

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *atlas)

{
  uint *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar7;
  stbtt__point sVar4;
  stbtt__point sVar5;
  undefined4 uVar8;
  undefined8 uVar6;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  stbtt_uint8 sVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  int iVar18;
  undefined4 uVar19;
  undefined1 uVar24;
  ImFontAtlas *pIVar20;
  ImFont *pIVar21;
  stbtt_uint8 *data;
  undefined6 uVar25;
  stbtt_packedchar *psVar22;
  undefined4 uVar26;
  stbtt__active_edge *psVar23;
  stbrp_node *psVar27;
  short sVar28;
  short sVar29;
  undefined1 auVar30 [12];
  undefined1 auVar31 [15];
  undefined1 auVar32 [14];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined4 uVar40;
  undefined4 uVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [15];
  unkuint9 Var44;
  undefined1 auVar45 [15];
  undefined1 auVar46 [13];
  undefined1 auVar47 [14];
  unkbyte10 Var48;
  undefined1 auVar49 [12];
  undefined1 auVar50 [15];
  uint6 uVar51;
  stbtt_packedchar *psVar52;
  stbrp_rect *psVar53;
  unsigned_short uVar54;
  unsigned_short uVar55;
  unsigned_short uVar56;
  unsigned_short uVar57;
  stbtt_uint32 sVar58;
  stbtt_uint32 sVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  undefined4 extraout_EAX;
  stbtt__active_edge *z;
  stbtt_uint32 sVar59;
  stbtt_uint32 sVar60;
  stbtt_uint32 sVar61;
  stbtt_uint32 sVar62;
  stbtt_uint32 sVar63;
  ImFontBuildSrcData *pIVar68;
  ImFontConfig *pIVar69;
  ImFont **ppIVar70;
  long lVar71;
  ImFontBuildDstData *pIVar72;
  stbrp_rect *psVar73;
  stbtt_packedchar *psVar74;
  int *piVar75;
  stbrp_context *ptr;
  uchar *puVar76;
  void *ptr_00;
  stbtt__edge *p_00;
  stbtt__buf *scanline;
  undefined8 *puVar77;
  stbtt__active_edge *psVar78;
  stbtt_uint32 *psVar79;
  ushort uVar80;
  ushort uVar81;
  stbrp_coord sVar82;
  ulong uVar83;
  long lVar84;
  stbtt__active_edge *psVar85;
  stbtt__buf *psVar86;
  int iVar87;
  ImWchar *src_range;
  ImWchar *pIVar88;
  ImU32 *it;
  ushort *puVar89;
  uint *puVar90;
  ImVector<ImFontConfig> *pIVar91;
  long lVar92;
  int output_i;
  int iVar93;
  uint uVar94;
  ulong uVar95;
  stbtt__edge *psVar96;
  uchar *puVar97;
  byte *pbVar98;
  stbtt__edge *psVar99;
  uchar *puVar100;
  int iVar101;
  int iVar102;
  int iVar103;
  void *p;
  stbtt__active_edge *psVar104;
  uchar *puVar105;
  ImBitVector *this;
  ImFontAtlas *pIVar106;
  ImU32 bit_n;
  uint uVar107;
  ulong uVar108;
  long lVar109;
  byte *pbVar110;
  bool bVar111;
  bool bVar112;
  char cVar122;
  float sum;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  undefined4 uVar124;
  undefined4 uVar126;
  undefined1 auVar117 [16];
  char cVar123;
  undefined1 extraout_var [12];
  short sVar125;
  undefined4 uVar127;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  float fVar130;
  float fVar131;
  float in_XMM3_Da;
  float fVar132;
  float fVar133;
  undefined1 auVar134 [16];
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  stbtt__buf sVar139;
  float y0_2;
  int local_4d8;
  int iStack_4d4;
  int local_4c0;
  int y1;
  undefined1 local_4b8 [8];
  int iStack_4b0;
  int iStack_4ac;
  long local_4a0;
  stbtt_uint32 charstrings;
  ImFontAtlas *local_490;
  undefined1 local_488 [16];
  ImVector<ImFontBuildSrcData> src_tmp_array;
  stbtt__point *local_460;
  stbrp_node *local_458;
  stbtt_uint32 fdarrayoff;
  undefined4 uStack_444;
  float local_43c;
  ImVector<ImFontConfig> *local_438;
  stbtt__edge *local_430;
  float *local_428;
  int local_41c;
  uint local_418;
  int local_414;
  int local_410;
  float local_40c;
  ImVector<stbrp_rect> buf_rects;
  ImVector<ImFontBuildDstData> dst_tmp_array;
  ImVector<stbtt_packedchar> buf_packedchars;
  undefined8 *local_3b8;
  int y0_1;
  int x0_1;
  int iy0;
  stbrp_context *local_378;
  ulong local_370;
  ulong local_368;
  ulong local_360;
  ulong local_358;
  ulong local_350;
  undefined1 local_348 [16];
  ImFontConfig *local_338;
  ulong local_330;
  uchar *local_328;
  ulong local_320;
  long local_318;
  size_t local_310;
  size_t local_308;
  ulong local_300;
  stbtt_packedchar *local_2f8;
  ulong local_2f0;
  long local_2e8;
  long local_2e0;
  uchar *local_2d8;
  int local_2d0;
  int x1_1;
  float local_2c8;
  undefined4 uStack_2c4;
  undefined4 uStack_2c0;
  undefined4 uStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [16];
  stbtt__buf b;
  
  if ((atlas->ConfigData).Size < 1) {
    __assert_fail("atlas->ConfigData.Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imgui_draw.cpp"
                  ,0x92b,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
  }
  ImFontAtlasBuildInit(atlas);
  atlas->TexID = (ImTextureID)0x0;
  atlas->TexWidth = 0;
  atlas->TexHeight = 0;
  (atlas->TexUvScale).x = 0.0;
  (atlas->TexUvScale).y = 0.0;
  (atlas->TexUvWhitePixel).x = 0.0;
  (atlas->TexUvWhitePixel).y = 0.0;
  ImFontAtlas::ClearTexData(atlas);
  src_tmp_array.Size = 0;
  src_tmp_array.Capacity = 0;
  src_tmp_array.Data = (ImFontBuildSrcData *)0x0;
  dst_tmp_array.Size = 0;
  dst_tmp_array.Capacity = 0;
  dst_tmp_array.Data = (ImFontBuildDstData *)0x0;
  ImVector<ImFontBuildSrcData>::resize(&src_tmp_array,(atlas->ConfigData).Size);
  ImVector<ImFontBuildDstData>::resize(&dst_tmp_array,(atlas->Fonts).Size);
  local_438 = &atlas->ConfigData;
  memset(src_tmp_array.Data,0,(long)src_tmp_array.Size * 0x110);
  memset(dst_tmp_array.Data,0,(long)dst_tmp_array.Size << 5);
  iVar65 = 0;
  local_490 = atlas;
  while (pIVar91 = local_438, pIVar106 = local_490, iVar18 = local_438->Size, local_41c = iVar65,
        iVar65 < iVar18) {
    pIVar68 = ImVector<ImFontBuildSrcData>::operator[](&src_tmp_array,iVar65);
    pIVar69 = ImVector<ImFontConfig>::operator[](pIVar91,iVar65);
    if ((pIVar69->DstFont == (ImFont *)0x0) ||
       (pIVar20 = pIVar69->DstFont->ContainerAtlas,
       pIVar20 != pIVar106 && pIVar20 != (ImFontAtlas *)0x0)) {
      __assert_fail("cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imgui_draw.cpp"
                    ,0x943,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
    }
    pIVar68->DstIndex = -1;
    iVar93 = 0;
    iVar65 = -1;
    while ((iVar93 < (atlas->Fonts).Size && (iVar65 == -1))) {
      pIVar21 = pIVar69->DstFont;
      ppIVar70 = ImVector<ImFont_*>::operator[](&atlas->Fonts,iVar93);
      if (pIVar21 == *ppIVar70) {
        pIVar68->DstIndex = iVar93;
        iVar65 = iVar93;
      }
      else {
        iVar65 = pIVar68->DstIndex;
      }
      iVar93 = iVar93 + 1;
    }
    if (iVar65 == -1) {
      __assert_fail("src_tmp.DstIndex != -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imgui_draw.cpp"
                    ,0x94c,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
    }
    data = (stbtt_uint8 *)pIVar69->FontData;
    local_488._0_8_ = pIVar69;
    iVar65 = pIVar69->FontNo;
    sVar13 = *data;
    if (sVar13 == '\0') {
      if (data[1] != '\x01') goto LAB_0015cf51;
LAB_0015ca2c:
      if ((data[2] != '\0') || (data[3] != '\0')) goto LAB_0015cf51;
LAB_0015ca44:
      sVar64 = -(uint)(iVar65 != 0);
    }
    else {
      if (sVar13 != 't') {
        if (sVar13 != 'O') {
          if ((sVar13 != '1') || (data[1] != '\0')) goto LAB_0015cf51;
          goto LAB_0015ca2c;
        }
        if (((data[1] != 'T') || (data[2] != 'T')) || (data[3] != 'O')) goto LAB_0015cf51;
        goto LAB_0015ca44;
      }
      sVar13 = data[1];
      if (sVar13 == 'r') {
        if ((data[2] != 'u') || (data[3] != 'e')) goto LAB_0015cf51;
        goto LAB_0015ca44;
      }
      if (sVar13 != 't') {
        if (((sVar13 != 'y') || (data[2] != 'p')) || (data[3] != '1')) goto LAB_0015cf51;
        goto LAB_0015ca44;
      }
      if (((data[2] != 'c') || (data[3] != 'f')) ||
         (((sVar64 = ttULONG(data + 4), sVar64 != 0x20000 && (sVar64 != 0x10000)) ||
          (uVar94 = *(uint *)(data + 8),
          (int)(uVar94 >> 0x18 | (uVar94 & 0xff0000) >> 8 | (uVar94 & 0xff00) << 8 | uVar94 << 0x18)
          <= iVar65)))) goto LAB_0015cf51;
      sVar64 = ttULONG(data + (long)iVar65 * 4 + 0xc);
    }
    if ((int)sVar64 < 0) {
LAB_0015cf51:
      __assert_fail("font_offset >= 0 && \"FontData is incorrect, or FontNo cannot be found.\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imgui_draw.cpp"
                    ,0x951,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
    }
    (pIVar68->FontInfo).data = data;
    (pIVar68->FontInfo).fontstart = sVar64;
    (pIVar68->FontInfo).cff.data = (uchar *)0x0;
    (pIVar68->FontInfo).cff.cursor = 0;
    (pIVar68->FontInfo).cff.size = 0;
    sVar58 = stbtt__find_table(data,sVar64,"cmap");
    sVar59 = stbtt__find_table(data,sVar64,"loca");
    (pIVar68->FontInfo).loca = sVar59;
    sVar60 = stbtt__find_table(data,sVar64,"head");
    local_4b8._0_4_ = sVar60;
    (pIVar68->FontInfo).head = sVar60;
    sVar60 = stbtt__find_table(data,sVar64,"glyf");
    (pIVar68->FontInfo).glyf = sVar60;
    sVar61 = stbtt__find_table(data,sVar64,"hhea");
    (pIVar68->FontInfo).hhea = sVar61;
    sVar62 = stbtt__find_table(data,sVar64,"hmtx");
    (pIVar68->FontInfo).hmtx = sVar62;
    sVar63 = stbtt__find_table(data,sVar64,"kern");
    (pIVar68->FontInfo).kern = sVar63;
    sVar63 = stbtt__find_table(data,sVar64,"GPOS");
    (pIVar68->FontInfo).gpos = sVar63;
    if ((((sVar58 == 0) || (local_4b8._0_4_ == 0)) || (sVar61 == 0)) || (sVar62 == 0))
    goto LAB_0015f39f;
    if (sVar60 == 0) {
      _charstrings = (stbtt__active_edge *)((ulong)_charstrings & 0xffffffff00000000);
      fdarrayoff = 0;
      buf_packedchars.Size = 2;
      y1 = 0;
      sVar59 = stbtt__find_table(data,sVar64,"CFF ");
      if (sVar59 == 0) goto LAB_0015f39f;
      (pIVar68->FontInfo).fdselect.data = (uchar *)0x0;
      (pIVar68->FontInfo).fdselect.cursor = 0;
      (pIVar68->FontInfo).fdselect.size = 0;
      (pIVar68->FontInfo).fontdicts.data = (uchar *)0x0;
      (pIVar68->FontInfo).fontdicts.cursor = 0;
      (pIVar68->FontInfo).fontdicts.size = 0;
      (pIVar68->FontInfo).cff.data = data + sVar59;
      (pIVar68->FontInfo).cff.cursor = 0;
      (pIVar68->FontInfo).cff.size = 0x20000000;
      puVar76 = (pIVar68->FontInfo).cff.data;
      uVar40 = (pIVar68->FontInfo).cff.cursor;
      uVar41 = (pIVar68->FontInfo).cff.size;
      b.data._0_4_ = (int)puVar76;
      b.data._4_4_ = (undefined4)((ulong)puVar76 >> 0x20);
      b.cursor = uVar40;
      b.size = uVar41;
      stbtt__buf_skip(&b,2);
      lVar71 = (long)b.cursor;
      uVar94 = 0;
      if (b.cursor < b.size) {
        b.cursor = b.cursor + 1;
        uVar94 = (uint)*(byte *)(CONCAT44(b.data._4_4_,(int)b.data) + lVar71);
      }
      stbtt__buf_seek(&b,uVar94);
      stbtt__cff_get_index(&b);
      sVar139 = stbtt__cff_get_index(&b);
      buf_rects = (ImVector<stbrp_rect>)stbtt__cff_index_get(sVar139,0);
      stbtt__cff_get_index(&b);
      sVar139 = stbtt__cff_get_index(&b);
      (pIVar68->FontInfo).gsubrs = sVar139;
      stbtt__dict_get_ints((stbtt__buf *)&buf_rects,0x11,1,&charstrings);
      stbtt__dict_get_ints((stbtt__buf *)&buf_rects,0x106,1,(stbtt_uint32 *)&buf_packedchars);
      stbtt__dict_get_ints((stbtt__buf *)&buf_rects,0x124,1,&fdarrayoff);
      stbtt__dict_get_ints((stbtt__buf *)&buf_rects,0x125,1,(stbtt_uint32 *)&y1);
      sVar139.data._4_4_ = b.data._4_4_;
      sVar139.data._0_4_ = (int)b.data;
      sVar139.cursor = b.cursor;
      sVar139.size = b.size;
      sVar139 = stbtt__get_subrs(sVar139,(stbtt__buf)buf_rects);
      iVar65 = y1;
      (pIVar68->FontInfo).subrs = sVar139;
      if ((buf_packedchars.Size != 2) || (sVar59 = charstrings, charstrings == 0))
      goto LAB_0015f39f;
      if (fdarrayoff != 0) {
        if (y1 == 0) goto LAB_0015f39f;
        stbtt__buf_seek(&b,fdarrayoff);
        sVar139 = stbtt__cff_get_index(&b);
        (pIVar68->FontInfo).fontdicts = sVar139;
        sVar139 = stbtt__buf_range(&b,iVar65,b.size - iVar65);
        (pIVar68->FontInfo).fdselect = sVar139;
      }
      stbtt__buf_seek(&b,sVar59);
      sVar139 = stbtt__cff_get_index(&b);
      (pIVar68->FontInfo).charstrings = sVar139;
    }
    else if (sVar59 == 0) goto LAB_0015f39f;
    sVar64 = stbtt__find_table(data,sVar64,"maxp");
    if (sVar64 == 0) {
      uVar94 = 0xffff;
    }
    else {
      uVar94 = (uint)(ushort)(*(ushort *)(data + (ulong)sVar64 + 4) << 8 |
                             *(ushort *)(data + (ulong)sVar64 + 4) >> 8);
    }
    (pIVar68->FontInfo).numGlyphs = uVar94;
    (pIVar68->FontInfo).svg = -1;
    uVar80 = *(ushort *)(data + (ulong)sVar58 + 2);
    (pIVar68->FontInfo).index_map = 0;
    uVar108 = (ulong)(ushort)(uVar80 << 8 | uVar80 >> 8);
    uVar94 = sVar58 + 4;
    iVar65 = 0;
    while (bVar111 = uVar108 != 0, uVar108 = uVar108 - 1, bVar111) {
      uVar80 = *(ushort *)(data + uVar94) << 8 | *(ushort *)(data + uVar94) >> 8;
      if ((uVar80 == 0) ||
         ((uVar80 == 3 &&
          ((uVar80 = *(ushort *)(data + (ulong)uVar94 + 2) << 8 |
                     *(ushort *)(data + (ulong)uVar94 + 2) >> 8, uVar80 == 10 || (uVar80 == 1))))))
      {
        sVar64 = ttULONG(data + (ulong)uVar94 + 4);
        iVar65 = sVar64 + sVar58;
        (pIVar68->FontInfo).index_map = iVar65;
      }
      uVar94 = uVar94 + 8;
    }
    if (iVar65 == 0) goto LAB_0015f39f;
    (pIVar68->FontInfo).indexToLocFormat =
         (uint)(ushort)(*(ushort *)(data + (long)(pIVar68->FontInfo).head + 0x32) << 8 |
                       *(ushort *)(data + (long)(pIVar68->FontInfo).head + 0x32) >> 8);
    pIVar72 = ImVector<ImFontBuildDstData>::operator[](&dst_tmp_array,pIVar68->DstIndex);
    pIVar88 = *(ImWchar **)(local_488._0_8_ + 0x38);
    if (pIVar88 == (ImWchar *)0x0) {
      pIVar88 = ImFontAtlas::GetGlyphRangesDefault::ranges;
    }
    pIVar68->SrcRanges = pIVar88;
    uVar94 = pIVar68->GlyphsHighest;
    for (; (*pIVar88 != 0 && (uVar80 = pIVar88[1], uVar80 != 0)); pIVar88 = pIVar88 + 2) {
      if ((int)uVar94 <= (int)(uint)uVar80) {
        uVar94 = (uint)uVar80;
      }
      pIVar68->GlyphsHighest = uVar94;
    }
    pIVar72->SrcCount = pIVar72->SrcCount + 1;
    if ((int)uVar94 < pIVar72->GlyphsHighest) {
      uVar94 = pIVar72->GlyphsHighest;
    }
    pIVar72->GlyphsHighest = uVar94;
    iVar65 = local_41c + 1;
  }
  iVar65 = 0;
  for (iVar93 = 0; iVar93 < src_tmp_array.Size; iVar93 = iVar93 + 1) {
    pIVar68 = ImVector<ImFontBuildSrcData>::operator[](&src_tmp_array,iVar93);
    pIVar72 = ImVector<ImFontBuildDstData>::operator[](&dst_tmp_array,pIVar68->DstIndex);
    ImBitVector::Create(&pIVar68->GlyphsSet,pIVar68->GlyphsHighest + 1);
    this = &pIVar72->GlyphsSet;
    if ((pIVar72->GlyphsSet).Storage.Size == 0) {
      ImBitVector::Create(this,pIVar72->GlyphsHighest + 1);
    }
    for (puVar89 = pIVar68->SrcRanges;
        (uVar94 = (uint)*puVar89, *puVar89 != 0 && (uVar80 = puVar89[1], uVar80 != 0));
        puVar89 = puVar89 + 2) {
      for (; uVar94 <= uVar80; uVar94 = uVar94 + 1) {
        bVar111 = ImBitVector::TestBit(this,uVar94);
        if ((!bVar111) && (iVar66 = stbtt_FindGlyphIndex(&pIVar68->FontInfo,uVar94), iVar66 != 0)) {
          pIVar68->GlyphsCount = pIVar68->GlyphsCount + 1;
          pIVar72->GlyphsCount = pIVar72->GlyphsCount + 1;
          ImBitVector::SetBit(&pIVar68->GlyphsSet,uVar94);
          ImBitVector::SetBit(this,uVar94);
          iVar65 = iVar65 + 1;
        }
        uVar80 = puVar89[1];
      }
    }
  }
  iVar93 = 0;
  while (pIVar91 = local_438, pIVar106 = local_490, iVar93 < src_tmp_array.Size) {
    local_4b8._0_4_ = iVar93;
    pIVar68 = ImVector<ImFontBuildSrcData>::operator[](&src_tmp_array,iVar93);
    ImVector<int>::reserve(&pIVar68->GlyphsList,pIVar68->GlyphsCount);
    local_488._0_8_ = &pIVar68->GlyphsSet;
    puVar90 = (pIVar68->GlyphsSet).Storage.Data;
    puVar1 = puVar90 + (pIVar68->GlyphsSet).Storage.Size;
    iVar93 = 0;
    for (; puVar90 < puVar1; puVar90 = puVar90 + 1) {
      uVar94 = *puVar90;
      if (uVar94 != 0) {
        for (uVar107 = 0; uVar107 != 0x20; uVar107 = uVar107 + 1) {
          if ((uVar94 >> (uVar107 & 0x1f) & 1) != 0) {
            b.data._0_4_ = uVar107 + iVar93;
            ImVector<int>::push_back(&pIVar68->GlyphsList,(int *)&b);
          }
        }
      }
      iVar93 = iVar93 + 0x20;
    }
    ImVector<unsigned_int>::clear((ImVector<unsigned_int> *)local_488._0_8_);
    iVar93 = local_4b8._0_4_ + 1;
    if ((pIVar68->GlyphsList).Size != pIVar68->GlyphsCount) {
      __assert_fail("src_tmp.GlyphsList.Size == src_tmp.GlyphsCount",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imgui_draw.cpp"
                    ,0x980,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
    }
  }
  for (iVar93 = 0; iVar93 < dst_tmp_array.Size; iVar93 = iVar93 + 1) {
    pIVar72 = ImVector<ImFontBuildDstData>::operator[](&dst_tmp_array,iVar93);
    ImVector<unsigned_int>::clear(&(pIVar72->GlyphsSet).Storage);
  }
  ImVector<ImFontBuildDstData>::clear(&dst_tmp_array);
  buf_rects.Size = 0;
  buf_rects.Capacity = 0;
  buf_rects.Data = (stbrp_rect *)0x0;
  buf_packedchars.Size = 0;
  buf_packedchars.Capacity = 0;
  buf_packedchars.Data = (stbtt_packedchar *)0x0;
  ImVector<stbrp_rect>::resize(&buf_rects,iVar65);
  ImVector<stbtt_packedchar>::resize(&buf_packedchars,iVar65);
  memset(buf_rects.Data,0,(long)buf_rects.Size * 0x18);
  memset(buf_packedchars.Data,0,(long)buf_packedchars.Size * 0x1c);
  iVar65 = 0;
  auVar128._12_4_ = 0;
  auVar128._0_12_ = local_488._4_12_;
  local_488 = auVar128 << 0x20;
  auVar42._12_4_ = 0;
  auVar42._0_12_ = stack0xfffffffffffffb4c;
  _local_4b8 = auVar42 << 0x20;
  for (iVar93 = 0; iVar93 < src_tmp_array.Size; iVar93 = iVar93 + 1) {
    pIVar68 = ImVector<ImFontBuildSrcData>::operator[](&src_tmp_array,iVar93);
    if (pIVar68->GlyphsCount != 0) {
      psVar73 = ImVector<stbrp_rect>::operator[](&buf_rects,local_488._0_4_);
      pIVar68->Rects = psVar73;
      psVar74 = ImVector<stbtt_packedchar>::operator[](&buf_packedchars,iVar65);
      pIVar68->PackedChars = psVar74;
      iVar66 = pIVar68->GlyphsCount;
      pIVar69 = ImVector<ImFontConfig>::operator[](pIVar91,iVar93);
      fVar113 = pIVar69->SizePixels;
      (pIVar68->PackRange).font_size = fVar113;
      (pIVar68->PackRange).first_unicode_codepoint_in_range = 0;
      (pIVar68->PackRange).array_of_unicode_codepoints = (pIVar68->GlyphsList).Data;
      iVar67 = (pIVar68->GlyphsList).Size;
      (pIVar68->PackRange).num_chars = iVar67;
      (pIVar68->PackRange).chardata_for_range = pIVar68->PackedChars;
      (pIVar68->PackRange).h_oversample = (uchar)pIVar69->OversampleH;
      (pIVar68->PackRange).v_oversample = (uchar)pIVar69->OversampleV;
      if (fVar113 <= 0.0) {
        uVar80 = *(ushort *)((pIVar68->FontInfo).data + (long)(pIVar68->FontInfo).head + 0x12);
        fVar113 = -fVar113 / (float)(ushort)(uVar80 << 8 | uVar80 >> 8);
      }
      else {
        fVar113 = stbtt_ScaleForPixelHeight(&pIVar68->FontInfo,fVar113);
      }
      local_488._0_4_ = local_488._0_4_ + iVar66;
      iVar65 = iVar65 + iVar66;
      iVar66 = pIVar106->TexGlyphPadding + -1;
      lVar71 = 8;
      for (lVar109 = 0; pIVar91 = local_438, pIVar106 = local_490, lVar109 < iVar67;
          lVar109 = lVar109 + 1) {
        piVar75 = ImVector<int>::operator[](&pIVar68->GlyphsList,(int)lVar109);
        iVar67 = stbtt_FindGlyphIndex(&pIVar68->FontInfo,*piVar75);
        if (iVar67 == 0) {
          __assert_fail("glyph_index_in_font != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imgui_draw.cpp"
                        ,0x9af,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
        }
        stbtt_GetGlyphBitmapBoxSubpixel
                  (&pIVar68->FontInfo,iVar67,(float)pIVar69->OversampleH * fVar113,
                   (float)pIVar69->OversampleV * fVar113,fVar113,in_XMM3_Da,(int *)&b,
                   (int *)&charstrings,(int *)&fdarrayoff,&y1);
        iVar67 = ((fdarrayoff + iVar66) - (int)b.data) + pIVar69->OversampleH;
        psVar73 = pIVar68->Rects;
        *(int *)((long)psVar73 + lVar71 + -4) = iVar67;
        iVar87 = ((y1 + iVar66) - charstrings) + pIVar69->OversampleV;
        *(int *)((long)&psVar73->id + lVar71) = iVar87;
        local_4b8._0_4_ = local_4b8._0_4_ + iVar87 * iVar67;
        iVar67 = (pIVar68->GlyphsList).Size;
        lVar71 = lVar71 + 0x18;
      }
    }
  }
  fVar113 = (float)(int)local_4b8._0_4_;
  if (fVar113 < 0.0) {
    fVar113 = sqrtf(fVar113);
  }
  else {
    fVar113 = SQRT(fVar113);
  }
  pIVar106->TexHeight = 0;
  local_4c0 = pIVar106->TexDesiredWidth;
  if (local_4c0 < 1) {
    iVar65 = (int)fVar113;
    local_4c0 = 0x1000;
    if ((iVar65 < 0xb33) && (local_4c0 = 0x800, iVar65 < 0x599)) {
      local_4c0 = (uint)(0x2cb < iVar65) * 0x200 + 0x200;
    }
  }
  pIVar106->TexWidth = local_4c0;
  fVar113 = (float)pIVar106->TexGlyphPadding;
  ptr = (stbrp_context *)ImGui::MemAlloc(0x48);
  iVar65 = local_4c0 - (int)fVar113;
  local_458 = (stbrp_node *)ImGui::MemAlloc((long)iVar65 << 4);
  if ((ptr == (stbrp_context *)0x0) || (local_458 == (stbrp_node *)0x0)) {
    if (ptr != (stbrp_context *)0x0) {
      ImGui::MemFree(ptr);
    }
    if (local_458 != (stbrp_node *)0x0) {
      ImGui::MemFree(local_458);
    }
    local_458 = (stbrp_node *)0x0;
    fVar113 = 0.0;
    local_4c0 = 0;
    ptr = (stbrp_context *)0x0;
  }
  else {
    uVar94 = iVar65 - 1;
    uVar95 = 0;
    psVar27 = local_458;
    uVar108 = uVar95;
    if (0 < (int)uVar94) {
      uVar95 = (ulong)uVar94;
      uVar108 = uVar95;
    }
    while( true ) {
      bVar111 = uVar95 == 0;
      uVar95 = uVar95 - 1;
      if (bVar111) break;
      psVar27->next = psVar27 + 1;
      psVar27 = psVar27 + 1;
    }
    local_458[uVar108].next = (stbrp_node *)0x0;
    ptr->init_mode = 1;
    ptr->heuristic = 0;
    ptr->free_head = local_458;
    ptr->active_head = ptr->extra;
    ptr->width = iVar65;
    ptr->height = 0x8000 - (int)fVar113;
    ptr->num_nodes = iVar65;
    ptr->align = (int)(uVar94 + iVar65) / iVar65;
    ptr->extra[0].x = 0;
    ptr->extra[0].y = 0;
    ptr->extra[0].next = ptr->extra + 1;
    ptr->extra[1].x = iVar65;
    ptr->extra[1].y = 0x40000000;
    ptr->extra[1].next = (stbrp_node *)0x0;
  }
  local_378 = ptr;
  ImFontAtlasBuildPackCustomRects(pIVar106,ptr);
  for (iVar65 = 0; iVar65 < src_tmp_array.Size; iVar65 = iVar65 + 1) {
    pIVar68 = ImVector<ImFontBuildSrcData>::operator[](&src_tmp_array,iVar65);
    if (pIVar68->GlyphsCount != 0) {
      stbrp_pack_rects(local_378,pIVar68->Rects,pIVar68->GlyphsCount);
      psVar73 = pIVar68->Rects;
      uVar108 = (ulong)(uint)pIVar68->GlyphsCount;
      if (pIVar68->GlyphsCount < 1) {
        uVar108 = 0;
      }
      for (lVar71 = 0; uVar108 * 0x18 - lVar71 != 0; lVar71 = lVar71 + 0x18) {
        if (*(int *)((long)&psVar73->was_packed + lVar71) != 0) {
          iVar93 = *(int *)((long)&psVar73->h + lVar71) + *(int *)((long)&psVar73->y + lVar71);
          if (iVar93 < pIVar106->TexHeight) {
            iVar93 = pIVar106->TexHeight;
          }
          pIVar106->TexHeight = iVar93;
        }
      }
    }
  }
  uVar94 = pIVar106->TexHeight;
  if ((pIVar106->Flags & 1) == 0) {
    uVar94 = (int)(uVar94 - 1) >> 1 | uVar94 - 1;
    uVar94 = (int)uVar94 >> 2 | uVar94;
    uVar94 = (int)uVar94 >> 4 | uVar94;
    uVar94 = (int)uVar94 >> 8 | uVar94;
    uVar94 = (int)uVar94 >> 0x10 | uVar94;
  }
  iVar65 = uVar94 + 1;
  pIVar106->TexHeight = iVar65;
  auVar117._0_4_ = (float)pIVar106->TexWidth;
  auVar117._4_4_ = (float)iVar65;
  auVar117._8_8_ = 0;
  auVar128 = divps(_DAT_001969c0,auVar117);
  pIVar106->TexUvScale = auVar128._0_8_;
  puVar76 = (uchar *)ImGui::MemAlloc((long)(iVar65 * pIVar106->TexWidth));
  pIVar106->TexPixelsAlpha8 = puVar76;
  memset(puVar76,0,(long)pIVar106->TexHeight * (long)pIVar106->TexWidth);
  uVar108 = 0;
  puVar76 = pIVar106->TexPixelsAlpha8;
  lVar71 = (long)local_4c0;
  local_328 = puVar76 + 1;
  local_4a0 = lVar71;
  local_298 = fVar113;
  fStack_294 = fVar113;
  fStack_290 = fVar113;
  fStack_28c = fVar113;
  while( true ) {
    iVar65 = (int)uVar108;
    if (src_tmp_array.Size <= iVar65) break;
    local_338 = ImVector<ImFontConfig>::operator[](local_438,iVar65);
    local_330 = uVar108;
    pIVar68 = ImVector<ImFontBuildSrcData>::operator[](&src_tmp_array,iVar65);
    if (pIVar68->GlyphsCount != 0) {
      psVar73 = pIVar68->Rects;
      bVar111 = true;
      uVar108 = 0xffffffffffffffff;
      lVar109 = 0;
      while( true ) {
        uVar127 = 0x80000000;
        uVar126 = 0x80000000;
        uVar124 = 0x80000000;
        if (!bVar111) break;
        fVar113 = (pIVar68->PackRange).font_size;
        if (fVar113 <= 0.0) {
          uVar80 = *(ushort *)((pIVar68->FontInfo).data + (long)(pIVar68->FontInfo).head + 0x12);
          local_2c8 = -fVar113 / (float)(ushort)(uVar80 << 8 | uVar80 >> 8);
        }
        else {
          uVar108 = uVar108 & 0xffffffff;
          local_2c8 = stbtt_ScaleForPixelHeight(&pIVar68->FontInfo,fVar113);
          uVar124 = extraout_var._0_4_;
          uVar126 = extraout_var._4_4_;
          uVar127 = extraout_var._8_4_;
        }
        uVar95._0_1_ = (pIVar68->PackRange).h_oversample;
        uVar24 = (pIVar68->PackRange).v_oversample;
        uVar25 = *(undefined6 *)&(pIVar68->PackRange).field_0x22;
        uVar95._1_7_ = CONCAT61(uVar25,uVar24);
        auVar31._8_6_ = 0;
        auVar31._0_8_ = uVar95;
        auVar31[0xe] = (char)((uint6)uVar25 >> 0x28);
        auVar33._8_4_ = 0;
        auVar33._0_8_ = uVar95;
        auVar33[0xc] = (char)((uint6)uVar25 >> 0x20);
        auVar33._13_2_ = auVar31._13_2_;
        auVar34._8_4_ = 0;
        auVar34._0_8_ = uVar95;
        auVar34._12_3_ = auVar33._12_3_;
        auVar35._8_2_ = 0;
        auVar35._0_8_ = uVar95;
        auVar35[10] = (char)((uint6)uVar25 >> 0x18);
        auVar35._11_4_ = auVar34._11_4_;
        auVar36._8_2_ = 0;
        auVar36._0_8_ = uVar95;
        auVar36._10_5_ = auVar35._10_5_;
        auVar37[8] = (char)((uint6)uVar25 >> 0x10);
        auVar37._0_8_ = uVar95;
        auVar37._9_6_ = auVar36._9_6_;
        auVar43._7_8_ = 0;
        auVar43._0_7_ = auVar37._8_7_;
        cVar123 = (char)((uint6)uVar25 >> 8);
        Var44 = CONCAT81(SUB158(auVar43 << 0x40,7),cVar123);
        auVar50._9_6_ = 0;
        auVar50._0_9_ = Var44;
        cVar122 = (char)uVar25;
        auVar38[4] = cVar122;
        auVar38._0_4_ = (uint)uVar95;
        auVar38._5_10_ = SUB1510(auVar50 << 0x30,5);
        auVar45._11_4_ = 0;
        auVar45._0_11_ = auVar38._4_11_;
        auVar46._1_12_ = SUB1512(auVar45 << 0x20,3);
        auVar46[0] = uVar24;
        uVar80 = CONCAT11(0,(undefined1)uVar95);
        auVar39._2_13_ = auVar46;
        auVar39._0_2_ = uVar80;
        uVar81 = auVar46._0_2_;
        sVar28 = -auVar38._4_2_;
        sVar125 = (short)Var44;
        sVar29 = -sVar125;
        local_370 = (ulong)uVar81;
        auVar32._10_2_ = 0;
        auVar32._0_10_ = auVar39._0_10_;
        auVar32._12_2_ = sVar125;
        uVar51 = CONCAT42(auVar32._10_4_,auVar38._4_2_);
        auVar47._6_8_ = 0;
        auVar47._0_6_ = uVar51;
        Var48 = CONCAT82(SUB148(auVar47 << 0x40,6),uVar81);
        local_268._0_4_ = CONCAT22(0,uVar80);
        local_268._4_10_ = Var48;
        local_268._14_2_ = 0;
        auVar118._0_4_ = (float)local_268._0_4_;
        auVar118._4_4_ = (float)(int)Var48;
        auVar118._8_4_ = (float)(int)uVar51;
        auVar118._12_4_ = (float)(auVar32._10_4_ >> 0x10);
        local_288 = divps(_DAT_001969c0,auVar118);
        auVar134[0] = -((undefined1)uVar95 == 0);
        auVar134[1] = -((undefined1)uVar95 == 0);
        auVar134[2] = -((undefined1)uVar95 == 0);
        auVar134[3] = -((undefined1)uVar95 == 0);
        auVar134[4] = -(uVar24 == '\0');
        auVar134[5] = -(uVar24 == '\0');
        auVar134[6] = -(uVar24 == '\0');
        auVar134[7] = -(uVar24 == '\0');
        auVar134[8] = -(cVar122 == '\0');
        auVar134[9] = -(cVar122 == '\0');
        auVar134[10] = -(cVar122 == '\0');
        auVar134[0xb] = -(cVar122 == '\0');
        auVar134[0xc] = -(cVar123 == '\0');
        auVar134[0xd] = -(cVar123 == '\0');
        auVar134[0xe] = -(cVar123 == '\0');
        auVar134[0xf] = -(cVar123 == '\0');
        Var48 = CONCAT64(CONCAT42(CONCAT22(sVar29,sVar29),sVar28),CONCAT22(sVar28,sVar29));
        auVar49._4_8_ = (long)((unkuint10)Var48 >> 0x10);
        auVar49._2_2_ = 1 - uVar81;
        auVar49._0_2_ = 1 - uVar81;
        auVar129._0_4_ = (float)(int)(short)(1 - uVar80);
        auVar129._4_4_ = (float)(auVar49._0_4_ >> 0x10);
        auVar129._8_4_ = (float)((int)((unkuint10)Var48 >> 0x10) >> 0x10);
        auVar129._12_4_ = (float)(int)sVar29;
        fVar113 = local_2c8 * auVar118._0_4_;
        local_2b8 = local_2c8 * auVar118._4_4_;
        fStack_2a0 = local_2c8 * auVar118._8_4_;
        fStack_29c = local_2c8 * auVar118._12_4_;
        auVar119._0_4_ = auVar118._0_4_ + auVar118._0_4_;
        auVar119._4_4_ = auVar118._4_4_ + auVar118._4_4_;
        auVar119._8_4_ = auVar118._8_4_ + auVar118._8_4_;
        auVar119._12_4_ = auVar118._12_4_ + auVar118._12_4_;
        local_278 = divps(auVar129,auVar119);
        local_278 = ~auVar134 & local_278;
        lVar109 = (long)(int)lVar109;
        fVar114 = local_2b8;
        if (fVar113 <= local_2b8) {
          fVar114 = fVar113;
        }
        local_40c = (0.35 / fVar114) * (0.35 / fVar114);
        fStack_254 = -local_2b8;
        local_350 = uVar95 & 0xff;
        local_358 = (ulong)((uint)uVar95._1_7_ & 0xff);
        local_320 = (ulong)((uint)uVar95 & 0xff);
        uVar95 = 0;
        uStack_2c4 = uVar124;
        uStack_2c0 = uVar126;
        uStack_2bc = uVar127;
        fStack_2b4 = local_2b8;
        fStack_2b0 = local_2b8;
        fStack_2ac = local_2b8;
        local_2a8 = fVar113;
        fStack_2a4 = local_2b8;
        local_258 = fVar113;
        fStack_250 = fVar113;
        fStack_24c = fStack_254;
LAB_0015d8c9:
        if ((long)uVar95 < (long)(pIVar68->PackRange).num_chars) {
          if (psVar73[lVar109].was_packed != 0) {
            if (psVar73[lVar109].w == 0) {
              if ((psVar73[lVar109].h == 0) && (-1 < (int)(uint)uVar108)) {
                psVar22 = (pIVar68->PackRange).chardata_for_range;
                psVar74 = psVar22 + (uVar108 & 0xffffffff);
                uVar54 = psVar74->x0;
                uVar55 = psVar74->y0;
                uVar56 = psVar74->x1;
                uVar57 = psVar74->y1;
                fVar131 = psVar74->xoff;
                fVar132 = psVar74->yoff;
                psVar74 = psVar22 + (uVar108 & 0xffffffff);
                fVar114 = psVar74->xadvance;
                fVar115 = psVar74->xoff2;
                fVar137 = psVar74->yoff2;
                psVar52 = psVar22 + uVar95;
                psVar52->yoff = psVar74->yoff;
                psVar52->xadvance = fVar114;
                psVar52->xoff2 = fVar115;
                psVar52->yoff2 = fVar137;
                psVar22 = psVar22 + uVar95;
                psVar22->x0 = uVar54;
                psVar22->y0 = uVar55;
                psVar22->x1 = uVar56;
                psVar22->y1 = uVar57;
                psVar22->xoff = fVar131;
                psVar22->yoff = fVar132;
              }
              goto LAB_0015f053;
            }
            if (psVar73[lVar109].h == 0) goto LAB_0015f053;
            piVar75 = (pIVar68->PackRange).array_of_unicode_codepoints;
            if (piVar75 == (int *)0x0) {
              iVar65 = (pIVar68->PackRange).first_unicode_codepoint_in_range + (int)uVar95;
            }
            else {
              iVar65 = piVar75[uVar95];
            }
            local_2f8 = (pIVar68->PackRange).chardata_for_range + uVar95;
            local_418 = (uint)uVar108;
            local_2f0 = uVar95;
            local_2e8 = lVar109;
            uVar94 = stbtt_FindGlyphIndex(&pIVar68->FontInfo,iVar65);
            psVar53 = psVar73 + lVar109;
            uVar9 = psVar53->w;
            uVar10 = psVar53->h;
            uVar11 = psVar53->x;
            uVar12 = psVar53->y;
            auVar30._8_4_ = uVar12;
            auVar30._4_4_ = uVar11;
            auVar30._0_4_ = uVar10 + (int)fStack_294;
            auVar120._0_8_ = auVar30._0_8_ << 0x20;
            auVar120._8_4_ = uVar11 + (int)fStack_290;
            auVar120._12_4_ = uVar12 + (int)fStack_28c;
            psVar73[lVar109].w = uVar9 - (int)local_298;
            psVar73[lVar109].h = uVar10 - (int)fStack_294;
            psVar73[lVar109].x = (int)auVar120._8_8_;
            psVar73[lVar109].y = (int)((ulong)auVar120._8_8_ >> 0x20);
            puVar105 = (pIVar68->FontInfo).data;
            uVar80 = *(ushort *)(puVar105 + (long)(pIVar68->FontInfo).hhea + 0x22) << 8 |
                     *(ushort *)(puVar105 + (long)(pIVar68->FontInfo).hhea + 0x22) >> 8;
            iVar65 = (pIVar68->FontInfo).hmtx;
            lVar84 = (ulong)uVar80 * 4 + (long)iVar65 + -4;
            lVar92 = (ulong)uVar80 * 4 + (long)iVar65 + -3;
            if ((int)uVar94 < (int)(uint)uVar80) {
              lVar84 = (long)(int)(uVar94 * 4) + (long)iVar65;
              lVar92 = (long)(int)(uVar94 * 4) + 1 + (long)iVar65;
            }
            bVar14 = puVar105[lVar84];
            bVar15 = puVar105[lVar92];
            fVar114 = local_298;
            stbtt_GetGlyphBitmapBoxSubpixel
                      (&pIVar68->FontInfo,uVar94,local_2a8,local_2b8,local_298,fVar113,&x0_1,&y0_1,
                       &x1_1,&local_2d0);
            iVar65 = psVar73[lVar109].x;
            iVar93 = psVar73[lVar109].y;
            uVar2 = psVar73[lVar109].w;
            uVar7 = psVar73[lVar109].h;
            local_360 = (ulong)uVar94;
            uVar94 = stbtt_GetGlyphShape(&pIVar68->FontInfo,uVar94,(stbtt_vertex **)&fdarrayoff);
            iVar87 = uVar2 - local_268._0_4_;
            local_4b8._4_4_ = (uVar7 - local_268._4_4_) + 1;
            local_4b8._0_4_ = iVar87 + 1;
            iStack_4b0 = 1 - local_268._8_4_;
            iStack_4ac = 1 - local_268._12_4_;
            stbtt_GetGlyphBitmapBoxSubpixel
                      (&pIVar68->FontInfo,(int)local_360,local_2a8,local_2b8,fVar114,fVar113,&y1,
                       &iy0,(int *)0x0,(int *)0x0);
            iVar66 = y1;
            auVar121._0_4_ = -(uint)(local_4b8._0_4_ == 0);
            auVar121._4_4_ = -(uint)(local_4b8._0_4_ == 0);
            auVar121._8_4_ = -(uint)(local_4b8._4_4_ == 0);
            auVar121._12_4_ = -(uint)(local_4b8._4_4_ == 0);
            iVar67 = movmskpd(extraout_EAX,auVar121);
            if (iVar67 == 0) {
              local_2d8 = puVar76 + iVar93 * lVar71 + (long)iVar65;
              lVar84 = CONCAT44(uStack_444,fdarrayoff);
              local_368 = (ulong)(uint)iy0;
              uVar95 = 0;
              uVar108 = (ulong)uVar94;
              if ((int)uVar94 < 1) {
                uVar108 = uVar95;
              }
              uVar83 = 0;
              for (; uVar108 * 0xe - uVar95 != 0; uVar95 = uVar95 + 0xe) {
                uVar83 = (ulong)((int)uVar83 + (uint)(*(char *)(lVar84 + 0xc + uVar95) == '\x01'));
              }
              if ((int)uVar83 != 0) {
                local_488._0_8_ = uVar83;
                ptr_00 = ImGui::MemAlloc(uVar83 * 4);
                if (ptr_00 != (void *)0x0) {
                  local_460 = (stbtt__point *)0x0;
                  iVar65 = 0;
                  iVar67 = 0;
                  iVar93 = 0;
                  do {
                    if (iVar67 == 1) {
                      local_460 = (stbtt__point *)ImGui::MemAlloc((long)iVar93 << 3);
                      if (local_460 == (stbtt__point *)0x0) {
                        ImGui::MemFree((void *)0x0);
                        ImGui::MemFree(ptr_00);
                        break;
                      }
                    }
                    else if (iVar67 == 2) goto LAB_0015dda2;
                    b.data._0_4_ = 0;
                    fVar113 = 0.0;
                    fVar114 = 0.0;
                    uVar94 = 0xffffffff;
                    for (lVar92 = 0; uVar108 * 0xe - lVar92 != 0; lVar92 = lVar92 + 0xe) {
                      iVar93 = (int)b.data;
                      switch(*(undefined1 *)(lVar84 + 0xc + lVar92)) {
                      case 1:
                        if (-1 < (int)uVar94) {
                          *(int *)((long)ptr_00 + (ulong)uVar94 * 4) = (int)b.data - iVar65;
                        }
                        uVar94 = uVar94 + 1;
                        auVar128 = pshuflw(ZEXT416(*(uint *)(lVar84 + lVar92)),
                                           ZEXT416(*(uint *)(lVar84 + lVar92)),0x60);
                        fVar113 = (float)(auVar128._0_4_ >> 0x10);
                        fVar114 = (float)(auVar128._4_4_ >> 0x10);
                        iVar65 = (int)b.data;
                        iVar93 = (int)b.data + 1;
                        if (local_460 != (stbtt__point *)0x0) {
                          local_460[(int)b.data].x = fVar113;
                          local_460[(int)b.data].y = fVar114;
                        }
                        break;
                      case 2:
                        auVar128 = pshuflw(ZEXT416(*(uint *)(lVar84 + lVar92)),
                                           ZEXT416(*(uint *)(lVar84 + lVar92)),0x60);
                        fVar113 = (float)(auVar128._0_4_ >> 0x10);
                        fVar114 = (float)(auVar128._4_4_ >> 0x10);
                        iVar93 = (int)b.data + 1;
                        if (local_460 != (stbtt__point *)0x0) {
                          local_460[(int)b.data].x = fVar113;
                          local_460[(int)b.data].y = fVar114;
                        }
                        break;
                      case 3:
                        stbtt__tesselate_curve
                                  (local_460,(int *)&b,fVar113,fVar114,
                                   (float)(int)*(short *)(lVar84 + 4 + lVar92),
                                   (float)(int)*(short *)(lVar84 + 6 + lVar92),
                                   (float)(int)*(short *)(lVar84 + lVar92),
                                   (float)(int)*(short *)(lVar84 + 2 + lVar92),local_40c,0);
                        goto LAB_0015dd21;
                      case 4:
                        stbtt__tesselate_cubic
                                  (local_460,(int *)&b,fVar113,fVar114,
                                   (float)(int)*(short *)(lVar84 + 4 + lVar92),
                                   (float)(int)*(short *)(lVar84 + 6 + lVar92),
                                   (float)(int)*(short *)(lVar84 + 8 + lVar92),
                                   (float)(int)*(short *)(lVar84 + 10 + lVar92),
                                   (float)(int)*(short *)(lVar84 + lVar92),
                                   (float)(int)*(short *)(lVar84 + 2 + lVar92),local_40c,0);
LAB_0015dd21:
                        auVar128 = pshuflw(ZEXT416(*(uint *)(lVar84 + lVar92)),
                                           ZEXT416(*(uint *)(lVar84 + lVar92)),0x60);
                        fVar113 = (float)(auVar128._0_4_ >> 0x10);
                        fVar114 = (float)(auVar128._4_4_ >> 0x10);
                        iVar93 = (int)b.data;
                      }
                      b.data._0_4_ = iVar93;
                    }
                    *(int *)((long)ptr_00 + (long)(int)uVar94 * 4) = (int)b.data - iVar65;
                    iVar67 = iVar67 + 1;
                    iVar93 = (int)b.data;
                  } while( true );
                }
              }
            }
            goto LAB_0015ea4c;
          }
          goto LAB_0015f053;
        }
        bVar111 = false;
      }
      fVar113 = local_338->RasterizerMultiply;
      if ((fVar113 != 1.0) || (NAN(fVar113))) {
        ImFontAtlasBuildMultiplyCalcLookupTable((uchar *)&b,fVar113);
        piVar75 = &pIVar68->Rects->was_packed;
        for (iVar65 = 0; iVar65 < pIVar68->GlyphsCount; iVar65 = iVar65 + 1) {
          if (*piVar75 != 0) {
            ImFontAtlasBuildMultiplyRectAlpha8
                      ((uchar *)&b,pIVar106->TexPixelsAlpha8,piVar75[-2],piVar75[-1],piVar75[-4],
                       piVar75[-3],pIVar106->TexWidth);
          }
          piVar75 = piVar75 + 6;
        }
      }
      pIVar68->Rects = (stbrp_rect *)0x0;
    }
    uVar108 = (ulong)((int)local_330 + 1);
  }
  ImGui::MemFree(local_458);
  ImGui::MemFree(local_378);
  ImVector<stbrp_rect>::clear(&buf_rects);
  uVar108 = 0;
  while( true ) {
    if (src_tmp_array.Size <= (int)uVar108) break;
    local_4b8 = (undefined1  [8])uVar108;
    pIVar68 = ImVector<ImFontBuildSrcData>::operator[](&src_tmp_array,(int)uVar108);
    if (pIVar68->GlyphsCount != 0) {
      pIVar69 = ImVector<ImFontConfig>::operator[](local_438,local_4b8._0_4_);
      pIVar21 = pIVar69->DstFont;
      fVar113 = stbtt_ScaleForPixelHeight(&pIVar68->FontInfo,pIVar69->SizePixels);
      puVar76 = (pIVar68->FontInfo).data;
      lVar71 = (long)(pIVar68->FontInfo).hhea;
      uVar80 = *(ushort *)(puVar76 + lVar71 + 4);
      uVar80 = uVar80 << 8 | uVar80 >> 8;
      fVar114 = -1.0;
      if (0 < (short)uVar80) {
        fVar114 = 1.0;
      }
      uVar81 = *(ushort *)(puVar76 + lVar71 + 6);
      uVar81 = uVar81 << 8 | uVar81 >> 8;
      fVar115 = -1.0;
      if (0 < (short)uVar81) {
        fVar115 = 1.0;
      }
      ImFontAtlasBuildSetupFont
                (local_490,pIVar21,pIVar69,
                 (float)(int)((float)(int)(short)uVar80 * fVar113 + fVar114),
                 (float)(int)((float)(int)(short)uVar81 * fVar113 + fVar115));
      fVar113 = (pIVar69->GlyphOffset).x;
      fVar114 = (float)(int)(pIVar21->Ascent + 0.5) + (pIVar69->GlyphOffset).y;
      lVar71 = 0;
      for (lVar109 = 0; lVar109 < pIVar68->GlyphsCount; lVar109 = lVar109 + 1) {
        pIVar88 = (ImWchar *)ImVector<int>::operator[](&pIVar68->GlyphsList,(int)lVar109);
        psVar74 = pIVar68->PackedChars;
        fVar137 = 1.0 / (float)local_490->TexHeight;
        fVar115 = 1.0 / (float)local_490->TexWidth;
        ImFont::AddGlyph(pIVar21,pIVar69,*pIVar88,
                         *(float *)((long)&psVar74->xoff + lVar71) + 0.0 + fVar113,
                         *(float *)((long)&psVar74->yoff + lVar71) + 0.0 + fVar114,
                         *(float *)((long)&psVar74->xoff2 + lVar71) + 0.0 + fVar113,
                         *(float *)((long)&psVar74->yoff2 + lVar71) + 0.0 + fVar114,
                         (float)*(ushort *)((long)&psVar74->x0 + lVar71) * fVar115,
                         (float)*(ushort *)((long)&psVar74->y0 + lVar71) * fVar137,
                         (float)*(ushort *)((long)&psVar74->x1 + lVar71) * fVar115,
                         (float)*(ushort *)((long)&psVar74->y1 + lVar71) * fVar137,
                         *(float *)((long)&psVar74->xadvance + lVar71));
        lVar71 = lVar71 + 0x1c;
      }
    }
    uVar108 = (ulong)(local_4b8._0_4_ + 1);
    pIVar106 = local_490;
  }
  ImVector<ImFontBuildSrcData>::clear_destruct(&src_tmp_array);
  ImFontAtlasBuildFinish(pIVar106);
  ImVector<stbtt_packedchar>::~ImVector(&buf_packedchars);
  ImVector<stbrp_rect>::~ImVector(&buf_rects);
LAB_0015f39f:
  bVar111 = iVar18 <= local_41c;
  ImVector<ImFontBuildDstData>::~ImVector(&dst_tmp_array);
  ImVector<ImFontBuildSrcData>::~ImVector(&src_tmp_array);
  return bVar111;
LAB_0015dda2:
  if (local_460 != (stbtt__point *)0x0) {
    iVar65 = 0;
    for (lVar84 = 0; local_488._0_8_ != lVar84; lVar84 = lVar84 + 1) {
      iVar65 = iVar65 + *(int *)((long)ptr_00 + lVar84 * 4);
    }
    p_00 = (stbtt__edge *)ImGui::MemAlloc((long)(iVar65 + 1) * 0x14);
    if (p_00 != (stbtt__edge *)0x0) {
      iVar65 = 0;
      iVar93 = 0;
      for (lVar84 = 0; lVar84 != local_488._0_8_; lVar84 = lVar84 + 1) {
        iVar67 = *(int *)((long)ptr_00 + lVar84 * 4);
        uVar95 = (ulong)(iVar67 - 1);
        iVar103 = iVar67;
        for (uVar108 = 0; iVar101 = (int)uVar95, (long)uVar108 < (long)iVar103;
            uVar108 = uVar108 + 1) {
          fVar113 = local_460[(long)iVar65 + (long)iVar101].y;
          fVar114 = local_460[(long)iVar65 + uVar108].y;
          if ((fVar113 != fVar114) || (NAN(fVar113) || NAN(fVar114))) {
            iVar102 = (int)uVar108;
            iVar103 = iVar101;
            if (fVar113 <= fVar114) {
              iVar103 = iVar102;
              iVar102 = iVar101;
            }
            p_00[iVar93].invert = (uint)(fVar114 < fVar113);
            sVar4 = local_460[(long)iVar65 + (long)iVar103];
            sVar5 = local_460[(long)iVar65 + (long)iVar102];
            psVar99 = p_00 + iVar93;
            psVar99->x0 = sVar4.x * local_258 + 0.0;
            psVar99->y0 = sVar4.y * fStack_254 + 0.0;
            psVar99->x1 = sVar5.x * fStack_250 + 0.0;
            psVar99->y1 = sVar5.y * fStack_24c + 0.0;
            iVar93 = iVar93 + 1;
            iVar103 = *(int *)((long)ptr_00 + lVar84 * 4);
          }
          uVar95 = uVar108 & 0xffffffff;
        }
        iVar65 = iVar67 + iVar65;
      }
      stbtt__sort_edges_quicksort(p_00,iVar93);
      psVar99 = p_00;
      for (uVar108 = 1; (long)uVar108 < (long)iVar93; uVar108 = uVar108 + 1) {
        uVar3 = p_00[uVar108].x0;
        uVar8 = p_00[uVar108].y0;
        b.cursor = p_00[uVar108].invert;
        uVar19 = p_00[uVar108].x1;
        uVar26 = p_00[uVar108].y1;
        psVar96 = psVar99;
        for (uVar95 = uVar108; 0 < (long)uVar95; uVar95 = uVar95 - 1) {
          if (psVar96->y0 <= (float)uVar8) goto LAB_0015df88;
          psVar96[1].invert = psVar96->invert;
          fVar113 = psVar96->y0;
          fVar114 = psVar96->x1;
          fVar115 = psVar96->y1;
          psVar96[1].x0 = psVar96->x0;
          psVar96[1].y0 = fVar113;
          psVar96[1].x1 = fVar114;
          psVar96[1].y1 = fVar115;
          psVar96 = psVar96 + -1;
        }
        uVar95 = 0;
LAB_0015df88:
        iVar65 = (int)uVar95;
        if (uVar108 != (uVar95 & 0xffffffff)) {
          p_00[iVar65].x0 = (float)uVar3;
          p_00[iVar65].y0 = (float)uVar8;
          p_00[iVar65].x1 = (float)uVar19;
          p_00[iVar65].y1 = (float)uVar26;
          p_00[iVar65].invert = b.cursor;
        }
        psVar99 = psVar99 + 1;
        b.data._0_4_ = uVar19;
        b.data._4_4_ = uVar26;
      }
      _charstrings = (stbtt__active_edge *)0x0;
      uVar124 = local_4b8._0_4_;
      scanline = &b;
      if (0x40 < (int)local_4b8._0_4_) {
        scanline = (stbtt__buf *)ImGui::MemAlloc((ulong)(uint)local_4b8._0_4_ * 8 + 4);
      }
      p_00[iVar93].y0 = (float)((int)local_368 + local_4b8._4_4_) + 1.0;
      local_2e0 = (long)(int)uVar124;
      local_428 = (float *)((long)&scanline->data + local_2e0 * 4);
      local_308 = local_2e0 * 4;
      local_43c = (float)(int)uVar124;
      local_310 = (long)(iVar87 + 2) << 2;
      uVar94 = 0;
      if (0 < (int)uVar124) {
        uVar94 = uVar124;
      }
      local_318 = 0;
      if (0 < local_2e0) {
        local_318 = local_2e0;
      }
      iVar65 = 0;
      local_300 = (ulong)(uint)local_4b8._4_4_;
      if ((int)local_4b8._4_4_ < 1) {
        local_300 = 0;
      }
      psVar104 = (stbtt__active_edge *)0x0;
      local_410 = 0;
      local_3b8 = (undefined8 *)0x0;
      uVar108 = local_368 & 0xffffffff;
      iVar93 = 0;
      psVar99 = p_00;
      while (iVar93 != (int)local_300) {
        fVar113 = (float)(int)uVar108;
        fVar114 = fVar113 + 1.0;
        local_430 = psVar99;
        local_414 = iVar93;
        memset(scanline,0,local_308);
        memset(local_428,0,local_310);
        psVar78 = (stbtt__active_edge *)&charstrings;
        while (psVar85 = psVar78, psVar23 = psVar85->next, psVar23 != (stbtt__active_edge *)0x0) {
          psVar78 = psVar23;
          if (psVar23->ey <= fVar113) {
            psVar85->next = psVar23->next;
            if ((psVar23->direction == 0.0) && (!NAN(psVar23->direction))) {
              __assert_fail("z->direction",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imstb_truetype.h"
                            ,0xd0b,
                            "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                           );
            }
            psVar23->direction = 0.0;
            psVar23->next = psVar104;
            psVar78 = psVar85;
            psVar104 = psVar23;
          }
        }
        bVar111 = (int)local_368 != 0;
        bVar112 = local_414 == 0;
        while( true ) {
          fVar115 = local_430->y0;
          if (fVar114 < fVar115) break;
          fVar137 = local_430->y1;
          puVar77 = local_3b8;
          if ((fVar115 != fVar137) || (psVar78 = psVar104, NAN(fVar115) || NAN(fVar137))) {
            if (psVar104 == (stbtt__active_edge *)0x0) {
              if (local_410 == 0) {
                puVar77 = (undefined8 *)ImGui::MemAlloc(0x6408);
                if (puVar77 == (undefined8 *)0x0) {
                  __assert_fail("z != __null",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imstb_truetype.h"
                                ,0xb32,
                                "stbtt__active_edge *stbtt__new_active(stbtt__hheap *, stbtt__edge *, int, float, void *)"
                               );
                }
                *puVar77 = local_3b8;
                fVar115 = local_430->y0;
                fVar137 = local_430->y1;
                local_410 = 799;
              }
              else {
                local_410 = local_410 + -1;
              }
              psVar104 = (stbtt__active_edge *)(puVar77 + (long)local_410 * 4 + 1);
              psVar78 = (stbtt__active_edge *)0x0;
            }
            else {
              psVar78 = psVar104->next;
            }
            fVar131 = local_430->x0;
            fVar132 = (local_430->x1 - fVar131) / (fVar137 - fVar115);
            psVar104->fdx = fVar132;
            psVar104->fdy = (float)(-(uint)(fVar132 != 0.0) & (uint)(1.0 / fVar132));
            psVar104->fx = ((fVar113 - fVar115) * fVar132 + fVar131) - (float)iVar66;
            psVar104->direction = *(float *)(&DAT_001ac6b0 + (ulong)(local_430->invert == 0) * 4);
            psVar104->sy = fVar115;
            psVar104->ey = fVar137;
            psVar104->next = (stbtt__active_edge *)0x0;
            if (fVar137 < fVar113 && (bVar112 && bVar111)) {
              psVar104->ey = fVar113;
              fVar137 = fVar113;
            }
            if (fVar137 < fVar113) {
              __assert_fail("z->ey >= scan_y_top",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imstb_truetype.h"
                            ,0xd1e,
                            "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                           );
            }
            psVar104->next = _charstrings;
            _charstrings = psVar104;
          }
          local_430 = local_430 + 1;
          local_3b8 = puVar77;
          psVar104 = psVar78;
        }
        psVar78 = _charstrings;
        if (_charstrings != (stbtt__active_edge *)0x0) {
          for (; psVar78 != (stbtt__active_edge *)0x0; psVar78 = psVar78->next) {
            fVar115 = psVar78->ey;
            if (fVar115 < fVar113) {
              __assert_fail("e->ey >= y_top",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imstb_truetype.h"
                            ,0xc17,
                            "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                           );
            }
            fVar131 = psVar78->fx;
            fVar137 = psVar78->fdx;
            if ((fVar137 != 0.0) || (NAN(fVar137))) {
              fVar132 = psVar78->sy;
              if (fVar114 < fVar132) {
                __assert_fail("e->sy <= y_bottom && e->ey >= y_top",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imstb_truetype.h"
                              ,0xc2a,
                              "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                             );
              }
              fVar136 = fVar137 + fVar131;
              fVar133 = (float)(~-(uint)(fVar113 < fVar132) & (uint)fVar131 |
                               (uint)((fVar132 - fVar113) * fVar137 + fVar131) &
                               -(uint)(fVar113 < fVar132));
              if ((((fVar133 < 0.0) ||
                   (fVar135 = (float)(~-(uint)(fVar115 < fVar114) & (uint)fVar136 |
                                     (uint)((fVar115 - fVar113) * fVar137 + fVar131) &
                                     -(uint)(fVar115 < fVar114)), fVar135 < 0.0)) ||
                  (local_43c <= fVar133)) || (local_43c <= fVar135)) {
                local_248 = ZEXT416((uint)fVar137);
                local_488 = ZEXT416((uint)fVar136);
                local_348 = ZEXT416((uint)fVar131);
                uVar107 = 0;
                while (uVar94 != uVar107) {
                  fVar133 = (float)(int)uVar107;
                  fVar137 = (float)(int)(uVar107 + 1);
                  fVar115 = (fVar133 - fVar131) / local_248._0_4_ + fVar113;
                  fVar132 = (fVar137 - fVar131) / local_248._0_4_ + fVar113;
                  if ((fVar133 <= fVar131) || (fVar136 <= fVar137)) {
                    if ((fVar136 < fVar133) && (fVar137 < fVar131)) {
                      local_4b8._0_4_ = fVar137;
                      stbtt__handle_clipped_edge
                                ((float *)scanline,uVar107,psVar78,fVar131,fVar113,fVar137,fVar132);
                      fVar131 = (float)local_4b8._0_4_;
                      fVar135 = fVar132;
LAB_0015e638:
                      stbtt__handle_clipped_edge
                                ((float *)scanline,uVar107,psVar78,fVar131,fVar135,fVar133,fVar115);
                      fVar131 = fVar133;
                      goto LAB_0015e652;
                    }
                    fVar135 = fVar113;
                    if (((fVar131 < fVar133) && (fVar133 < fVar136)) ||
                       ((fVar136 < fVar133 && (fVar133 < fVar131)))) goto LAB_0015e638;
                    fVar115 = fVar113;
                    if (((fVar131 < fVar137) && (fVar137 < fVar136)) ||
                       ((fVar136 < fVar137 && (fVar137 < fVar131)))) {
                      local_4b8._0_4_ = fVar137;
                      goto LAB_0015e5a6;
                    }
                  }
                  else {
                    local_4b8._0_4_ = fVar137;
                    stbtt__handle_clipped_edge
                              ((float *)scanline,uVar107,psVar78,fVar131,fVar113,fVar133,fVar115);
                    fVar131 = fVar133;
                    fVar137 = (float)local_4b8._0_4_;
LAB_0015e5a6:
                    stbtt__handle_clipped_edge
                              ((float *)scanline,uVar107,psVar78,fVar131,fVar115,fVar137,fVar132);
                    fVar131 = (float)local_4b8._0_4_;
                    fVar115 = fVar132;
LAB_0015e652:
                    fVar136 = (float)local_488._0_4_;
                  }
                  stbtt__handle_clipped_edge
                            ((float *)scanline,uVar107,psVar78,fVar131,fVar115,fVar136,fVar114);
                  fVar131 = (float)local_348._0_4_;
                  fVar136 = (float)local_488._0_4_;
                  uVar107 = uVar107 + 1;
                }
              }
              else {
                if (fVar132 <= fVar113) {
                  fVar132 = fVar113;
                }
                uVar107 = (uint)fVar133;
                uVar95 = (ulong)uVar107;
                if (fVar114 <= fVar115) {
                  fVar115 = fVar114;
                }
                if (uVar107 == (int)fVar135) {
                  if (((int)uVar107 < 0) || ((int)uVar124 <= (int)uVar107)) {
                    __assert_fail("x >= 0 && x < len",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imstb_truetype.h"
                                  ,0xc46,
                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                 );
                  }
                  fVar137 = (fVar115 - fVar132) * psVar78->direction;
                  fVar115 = stbtt__position_trapezoid_area
                                      (fVar137,fVar133,(float)(int)uVar107 + 1.0,fVar135,
                                       (float)(int)uVar107 + 1.0);
                  *(float *)((long)&scanline->data + uVar95 * 4) =
                       fVar115 + *(float *)((long)&scanline->data + uVar95 * 4);
                  local_428[uVar95 + 1] = fVar137 + local_428[uVar95 + 1];
                }
                else {
                  fVar116 = psVar78->fdy;
                  fVar130 = fVar135;
                  if (fVar135 < fVar133) {
                    fVar130 = fVar113 - fVar132;
                    fVar132 = (fVar113 - fVar115) + fVar114;
                    fVar137 = -fVar137;
                    fVar116 = -fVar116;
                    fVar131 = fVar136;
                    fVar115 = fVar130 + fVar114;
                    fVar130 = fVar133;
                    fVar133 = fVar135;
                  }
                  if (fVar116 < 0.0) {
                    __assert_fail("dy >= 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imstb_truetype.h"
                                  ,0xc58,
                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                 );
                  }
                  if (fVar137 < 0.0) {
                    __assert_fail("dx >= 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imstb_truetype.h"
                                  ,0xc59,
                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                 );
                  }
                  iVar67 = (int)fVar133;
                  iVar93 = iVar67 + 1;
                  fVar135 = ((float)iVar93 - fVar131) * fVar116 + fVar113;
                  fVar136 = (float)(int)fVar130;
                  fVar137 = fVar114;
                  if (fVar135 <= fVar114) {
                    fVar137 = fVar135;
                  }
                  fVar135 = psVar78->direction;
                  fVar138 = (fVar137 - fVar132) * fVar135;
                  fVar131 = (fVar136 - fVar131) * fVar116 + fVar113;
                  *(float *)((long)&scanline->data + (long)iVar67 * 4) =
                       ((float)iVar93 - fVar133) * fVar138 * 0.5 +
                       *(float *)((long)&scanline->data + (long)iVar67 * 4);
                  if ((fVar114 < fVar131) &&
                     (iVar67 = (int)fVar130 - iVar93, fVar131 = fVar114, iVar67 != 0)) {
                    fVar116 = (fVar114 - fVar137) / (float)iVar67;
                  }
                  lVar92 = (long)(int)fVar130;
                  for (lVar84 = (long)iVar93; lVar84 < lVar92; lVar84 = lVar84 + 1) {
                    *(float *)((long)&scanline->data + lVar84 * 4) =
                         fVar116 * fVar135 * 0.5 + fVar138 +
                         *(float *)((long)&scanline->data + lVar84 * 4);
                    fVar138 = fVar138 + fVar116 * fVar135;
                  }
                  if (1.01 < ABS(fVar138)) {
                    __assert_fail("fabsf(area) <= 1.01f",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imstb_truetype.h"
                                  ,0xc9c,
                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                 );
                  }
                  if (fVar115 <= fVar131 + -0.01) {
                    __assert_fail("sy1 > y_final-0.01f",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imstb_truetype.h"
                                  ,0xc9d,
                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                 );
                  }
                  _local_4b8 = ZEXT416((uint)fVar138);
                  fVar137 = stbtt__position_trapezoid_area
                                      (fVar115 - fVar131,fVar136,fVar136 + 1.0,fVar130,fVar136 + 1.0
                                      );
                  *(float *)((long)&scanline->data + lVar92 * 4) =
                       fVar137 * fVar135 + (float)local_4b8._0_4_ +
                       *(float *)((long)&scanline->data + lVar92 * 4);
                  local_428[lVar92 + 1] = (fVar115 - fVar132) * fVar135 + local_428[lVar92 + 1];
                }
              }
            }
            else if (fVar131 < local_43c) {
              if (0.0 <= fVar131) {
                local_348 = ZEXT416((uint)fVar131);
                stbtt__handle_clipped_edge
                          ((float *)scanline,(int)fVar131,psVar78,fVar131,fVar113,fVar131,fVar114);
                iVar93 = (int)fVar131 + 1;
                fVar131 = (float)local_348._0_4_;
              }
              else {
                iVar93 = 0;
              }
              stbtt__handle_clipped_edge(local_428,iVar93,psVar78,fVar131,fVar113,fVar131,fVar114);
            }
          }
        }
        fVar113 = 0.0;
        lVar84 = local_318;
        psVar86 = scanline;
        iVar93 = iVar65;
        while (bVar111 = lVar84 != 0, lVar84 = lVar84 + -1, bVar111) {
          fVar113 = fVar113 + *(float *)((long)&psVar86->data + local_2e0 * 4);
          iVar67 = (int)(ABS(*(float *)&psVar86->data + fVar113) * 255.0 + 0.5);
          if (0xfe < iVar67) {
            iVar67 = 0xff;
          }
          local_2d8[iVar93] = (uchar)iVar67;
          iVar93 = iVar93 + 1;
          psVar86 = (stbtt__buf *)((long)&psVar86->data + 4);
        }
        psVar79 = &charstrings;
        while (psVar79 = *(stbtt_uint32 **)psVar79, psVar79 != (stbtt_uint32 *)0x0) {
          psVar79[2] = (stbtt_uint32)((float)psVar79[3] + (float)psVar79[2]);
        }
        uVar108 = (ulong)((int)uVar108 + 1);
        iVar65 = iVar65 + local_4c0;
        psVar99 = local_430;
        iVar93 = local_414 + 1;
      }
      while (local_3b8 != (undefined8 *)0x0) {
        puVar77 = (undefined8 *)*local_3b8;
        ImGui::MemFree(local_3b8);
        local_3b8 = puVar77;
      }
      if (scanline != &b) {
        ImGui::MemFree(scanline);
      }
      ImGui::MemFree(p_00);
    }
    ImGui::MemFree(ptr_00);
    ImGui::MemFree(local_460);
  }
LAB_0015ea4c:
  ImGui::MemFree((void *)CONCAT44(uStack_444,fdarrayoff));
  uVar108 = local_320;
  sVar82 = psVar73[lVar109].x;
  iVar65 = psVar73[lVar109].y;
  uVar6._0_4_ = psVar73[lVar109].w;
  uVar6._4_4_ = psVar73[lVar109].h;
  if (1 < (byte)local_350) {
    puVar105 = puVar76 + (long)(iVar65 * local_4c0) + (long)sVar82;
    b.data._0_4_ = 0;
    b.data._4_4_ = 0;
    iVar67 = (int)local_320;
    iVar93 = (undefined4)uVar6 - iVar67;
    iVar87 = 0;
    iVar66 = uVar6._4_4_;
    if ((int)uVar6._4_4_ < 1) {
      iVar66 = iVar87;
    }
    if (iVar93 < 0) {
      iVar93 = -1;
    }
    puVar100 = local_328 + (long)iVar93 + (long)sVar82 + (long)(iVar65 * local_4c0);
    lVar84 = (long)iVar93 + 1;
    for (; uVar95 = local_350, iVar87 != iVar66; iVar87 = iVar87 + 1) {
      memset(&b,0,local_350);
      puVar97 = puVar100;
      lVar71 = lVar84;
      switch((int)uVar95) {
      case 2:
        uVar95 = 0;
        for (lVar92 = 0; lVar84 != lVar92; lVar92 = lVar92 + 1) {
          bVar16 = puVar105[lVar92];
          bVar17 = *(byte *)((long)&b.data + (ulong)((uint)lVar92 & 7));
          *(byte *)((long)&b.data + (ulong)((uint)lVar92 + 2 & 7)) = bVar16;
          uVar94 = (int)uVar95 + ((uint)bVar16 - (uint)bVar17);
          uVar95 = (ulong)uVar94;
          puVar105[lVar92] = (uchar)(uVar94 >> 1);
        }
        break;
      case 3:
        uVar95 = 0;
        for (lVar92 = 0; lVar84 != lVar92; lVar92 = lVar92 + 1) {
          bVar16 = puVar105[lVar92];
          bVar17 = *(byte *)((long)&b.data + (ulong)((uint)lVar92 & 7));
          *(byte *)((long)&b.data + (ulong)((uint)lVar92 + 3 & 7)) = bVar16;
          uVar95 = (ulong)((int)uVar95 + ((uint)bVar16 - (uint)bVar17));
          puVar105[lVar92] = (uchar)(uVar95 / 3);
        }
        break;
      case 4:
        uVar95 = 0;
        for (lVar92 = 0; lVar84 != lVar92; lVar92 = lVar92 + 1) {
          bVar16 = puVar105[lVar92];
          uVar83 = (ulong)((uint)lVar92 & 7);
          bVar17 = *(byte *)((long)&b.data + uVar83);
          *(byte *)((long)&b.data + (uVar83 ^ 4)) = bVar16;
          uVar94 = (int)uVar95 + ((uint)bVar16 - (uint)bVar17);
          uVar95 = (ulong)uVar94;
          puVar105[lVar92] = (uchar)(uVar94 >> 2);
        }
        break;
      case 5:
        uVar95 = 0;
        for (lVar92 = 0; lVar84 != lVar92; lVar92 = lVar92 + 1) {
          bVar16 = puVar105[lVar92];
          bVar17 = *(byte *)((long)&b.data + (ulong)((uint)lVar92 & 7));
          *(byte *)((long)&b.data + (ulong)((uint)lVar92 + 5 & 7)) = bVar16;
          uVar95 = (ulong)((int)uVar95 + ((uint)bVar16 - (uint)bVar17));
          puVar105[lVar92] = (uchar)(uVar95 / 5);
        }
        break;
      default:
        uVar95 = 0;
        for (lVar92 = 0; lVar84 != lVar92; lVar92 = lVar92 + 1) {
          bVar16 = puVar105[lVar92];
          bVar17 = *(byte *)((long)&b.data + (ulong)((uint)lVar92 & 7));
          *(byte *)((long)&b.data + (ulong)(iVar67 + (uint)lVar92 & 7)) = bVar16;
          uVar95 = (ulong)((int)uVar95 + ((uint)bVar16 - (uint)bVar17));
          puVar105[lVar92] = (uchar)(uVar95 / (uVar108 & 0xffffffff));
        }
      }
      for (; lVar71 < (int)(undefined4)uVar6; lVar71 = lVar71 + 1) {
        if (*puVar97 != '\0') {
          __assert_fail("pixels[i] == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imstb_truetype.h"
                        ,0xfe9,
                        "void stbtt__h_prefilter(unsigned char *, int, int, int, unsigned int)");
        }
        uVar95 = (ulong)((int)uVar95 - (uint)*(byte *)((long)&b.data + (ulong)((uint)lVar71 & 7)));
        *puVar97 = (uchar)(uVar95 / (uVar108 & 0xffffffff));
        puVar97 = puVar97 + 1;
      }
      puVar105 = puVar105 + local_4a0;
      puVar100 = puVar100 + local_4a0;
      lVar71 = local_4a0;
    }
    sVar82 = psVar73[lVar109].x;
    iVar65 = psVar73[lVar109].y;
    uVar6._0_4_ = psVar73[lVar109].w;
    uVar6._4_4_ = psVar73[lVar109].h;
  }
  uVar108 = local_370;
  if (1 < (byte)local_358) {
    lVar84 = (long)(iVar65 * (int)lVar71);
    pbVar110 = puVar76 + lVar84 + sVar82;
    iVar87 = (int)((ulong)uVar6 >> 0x20);
    b.data._0_4_ = 0;
    b.data._4_4_ = 0;
    iVar66 = (int)local_370;
    iVar65 = iVar87 - iVar66;
    iVar67 = 0;
    iVar93 = (int)uVar6;
    if ((int)uVar6 < 1) {
      iVar93 = iVar67;
    }
    if (iVar65 < 0) {
      iVar65 = -1;
    }
    lVar92 = (long)iVar65 + 1;
    puVar105 = puVar76 + lVar71 * lVar92 + sVar82 + lVar84;
    for (; uVar95 = local_358, iVar67 != iVar93; iVar67 = iVar67 + 1) {
      memset(&b,0,local_358);
      puVar100 = puVar105;
      lVar71 = lVar92;
      switch((int)uVar95) {
      case 2:
        uVar95 = 0;
        pbVar98 = pbVar110;
        for (lVar84 = 0; lVar92 != lVar84; lVar84 = lVar84 + 1) {
          bVar16 = *pbVar98;
          bVar17 = *(byte *)((long)&b.data + (ulong)((uint)lVar84 & 7));
          *(byte *)((long)&b.data + (ulong)((uint)lVar84 + 2 & 7)) = bVar16;
          uVar94 = (int)uVar95 + ((uint)bVar16 - (uint)bVar17);
          uVar95 = (ulong)uVar94;
          *pbVar98 = (byte)(uVar94 >> 1);
          pbVar98 = pbVar98 + local_4a0;
        }
        break;
      case 3:
        uVar95 = 0;
        pbVar98 = pbVar110;
        for (lVar84 = 0; lVar92 != lVar84; lVar84 = lVar84 + 1) {
          bVar16 = *pbVar98;
          bVar17 = *(byte *)((long)&b.data + (ulong)((uint)lVar84 & 7));
          *(byte *)((long)&b.data + (ulong)((uint)lVar84 + 3 & 7)) = bVar16;
          uVar95 = (ulong)((int)uVar95 + ((uint)bVar16 - (uint)bVar17));
          *pbVar98 = (byte)(uVar95 / 3);
          pbVar98 = pbVar98 + local_4a0;
        }
        break;
      case 4:
        uVar95 = 0;
        pbVar98 = pbVar110;
        for (lVar84 = 0; lVar92 != lVar84; lVar84 = lVar84 + 1) {
          bVar16 = *pbVar98;
          uVar83 = (ulong)((uint)lVar84 & 7);
          bVar17 = *(byte *)((long)&b.data + uVar83);
          *(byte *)((long)&b.data + (uVar83 ^ 4)) = bVar16;
          uVar94 = (int)uVar95 + ((uint)bVar16 - (uint)bVar17);
          uVar95 = (ulong)uVar94;
          *pbVar98 = (byte)(uVar94 >> 2);
          pbVar98 = pbVar98 + local_4a0;
        }
        break;
      case 5:
        uVar95 = 0;
        pbVar98 = pbVar110;
        for (lVar84 = 0; lVar92 != lVar84; lVar84 = lVar84 + 1) {
          bVar16 = *pbVar98;
          bVar17 = *(byte *)((long)&b.data + (ulong)((uint)lVar84 & 7));
          *(byte *)((long)&b.data + (ulong)((uint)lVar84 + 5 & 7)) = bVar16;
          uVar95 = (ulong)((int)uVar95 + ((uint)bVar16 - (uint)bVar17));
          *pbVar98 = (byte)(uVar95 / 5);
          pbVar98 = pbVar98 + local_4a0;
        }
        break;
      default:
        uVar95 = 0;
        pbVar98 = pbVar110;
        for (lVar84 = 0; lVar92 != lVar84; lVar84 = lVar84 + 1) {
          bVar16 = *pbVar98;
          bVar17 = *(byte *)((long)&b.data + (ulong)((uint)lVar84 & 7));
          *(byte *)((long)&b.data + (ulong)(iVar66 + (uint)lVar84 & 7)) = bVar16;
          uVar95 = (ulong)((int)uVar95 + ((uint)bVar16 - (uint)bVar17));
          *pbVar98 = (byte)(uVar95 / (uVar108 & 0xffffffff));
          pbVar98 = pbVar98 + local_4a0;
        }
      }
      for (; lVar71 < iVar87; lVar71 = lVar71 + 1) {
        if (*puVar100 != '\0') {
          __assert_fail("pixels[i*stride_in_bytes] == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imstb_truetype.h"
                        ,0x1027,
                        "void stbtt__v_prefilter(unsigned char *, int, int, int, unsigned int)");
        }
        uVar95 = (ulong)((int)uVar95 - (uint)*(byte *)((long)&b.data + (ulong)((uint)lVar71 & 7)));
        *puVar100 = (uchar)(uVar95 / (uVar108 & 0xffffffff));
        puVar100 = puVar100 + local_4a0;
      }
      pbVar110 = pbVar110 + 1;
      puVar105 = puVar105 + 1;
      lVar71 = local_4a0;
    }
    sVar82 = psVar73[lVar109].x;
    iVar65 = psVar73[lVar109].y;
    uVar6._0_4_ = psVar73[lVar109].w;
    uVar6._4_4_ = psVar73[lVar109].h;
  }
  local_2f8->x0 = (unsigned_short)sVar82;
  local_2f8->y0 = (unsigned_short)iVar65;
  local_2f8->x1 = (short)uVar6 + (unsigned_short)sVar82;
  local_2f8->y1 = (short)((ulong)uVar6 >> 0x20) + (unsigned_short)iVar65;
  local_2f8->xadvance = (float)(int)(short)((ushort)bVar14 * 0x100 + (ushort)bVar15) * local_2c8;
  local_2f8->xoff = (float)x0_1 * (float)local_288._0_4_ + (float)local_278._0_4_;
  local_2f8->yoff = (float)y0_1 * (float)local_288._4_4_ + (float)local_278._4_4_;
  local_2f8->xoff2 = (float)(x0_1 + (int)uVar6) * (float)local_288._0_4_ + (float)local_278._0_4_;
  local_2f8->yoff2 =
       (float)(y0_1 + (int)((ulong)uVar6 >> 0x20)) * (float)local_288._4_4_ + (float)local_278._4_4_
  ;
  uVar108 = (ulong)local_418;
  lVar109 = local_2e8;
  uVar95 = local_2f0;
  pIVar106 = local_490;
  fVar113 = (float)local_278._0_4_;
  if ((int)local_360 == 0) {
    uVar108 = local_2f0 & 0xffffffff;
  }
LAB_0015f053:
  lVar109 = lVar109 + 1;
  uVar95 = uVar95 + 1;
  goto LAB_0015d8c9;
}

Assistant:

static bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas* atlas)
{
    IM_ASSERT(atlas->ConfigData.Size > 0);

    ImFontAtlasBuildInit(atlas);

    // Clear atlas
    atlas->TexID = (ImTextureID)NULL;
    atlas->TexWidth = atlas->TexHeight = 0;
    atlas->TexUvScale = ImVec2(0.0f, 0.0f);
    atlas->TexUvWhitePixel = ImVec2(0.0f, 0.0f);
    atlas->ClearTexData();

    // Temporary storage for building
    ImVector<ImFontBuildSrcData> src_tmp_array;
    ImVector<ImFontBuildDstData> dst_tmp_array;
    src_tmp_array.resize(atlas->ConfigData.Size);
    dst_tmp_array.resize(atlas->Fonts.Size);
    memset(src_tmp_array.Data, 0, (size_t)src_tmp_array.size_in_bytes());
    memset(dst_tmp_array.Data, 0, (size_t)dst_tmp_array.size_in_bytes());

    // 1. Initialize font loading structure, check font data validity
    for (int src_i = 0; src_i < atlas->ConfigData.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        IM_ASSERT(cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas));

        // Find index from cfg.DstFont (we allow the user to set cfg.DstFont. Also it makes casual debugging nicer than when storing indices)
        src_tmp.DstIndex = -1;
        for (int output_i = 0; output_i < atlas->Fonts.Size && src_tmp.DstIndex == -1; output_i++)
            if (cfg.DstFont == atlas->Fonts[output_i])
                src_tmp.DstIndex = output_i;
        if (src_tmp.DstIndex == -1)
        {
            IM_ASSERT(src_tmp.DstIndex != -1); // cfg.DstFont not pointing within atlas->Fonts[] array?
            return false;
        }
        // Initialize helper structure for font loading and verify that the TTF/OTF data is correct
        const int font_offset = stbtt_GetFontOffsetForIndex((unsigned char*)cfg.FontData, cfg.FontNo);
        IM_ASSERT(font_offset >= 0 && "FontData is incorrect, or FontNo cannot be found.");
        if (!stbtt_InitFont(&src_tmp.FontInfo, (unsigned char*)cfg.FontData, font_offset))
            return false;

        // Measure highest codepoints
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.SrcRanges = cfg.GlyphRanges ? cfg.GlyphRanges : atlas->GetGlyphRangesDefault();
        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            src_tmp.GlyphsHighest = ImMax(src_tmp.GlyphsHighest, (int)src_range[1]);
        dst_tmp.SrcCount++;
        dst_tmp.GlyphsHighest = ImMax(dst_tmp.GlyphsHighest, src_tmp.GlyphsHighest);
    }

    // 2. For every requested codepoint, check for their presence in the font data, and handle redundancy or overlaps between source fonts to avoid unused glyphs.
    int total_glyphs_count = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.GlyphsSet.Create(src_tmp.GlyphsHighest + 1);
        if (dst_tmp.GlyphsSet.Storage.empty())
            dst_tmp.GlyphsSet.Create(dst_tmp.GlyphsHighest + 1);

        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            for (unsigned int codepoint = src_range[0]; codepoint <= src_range[1]; codepoint++)
            {
                if (dst_tmp.GlyphsSet.TestBit(codepoint))    // Don't overwrite existing glyphs. We could make this an option for MergeMode (e.g. MergeOverwrite==true)
                    continue;
                if (!stbtt_FindGlyphIndex(&src_tmp.FontInfo, codepoint))    // It is actually in the font?
                    continue;

                // Add to avail set/counters
                src_tmp.GlyphsCount++;
                dst_tmp.GlyphsCount++;
                src_tmp.GlyphsSet.SetBit(codepoint);
                dst_tmp.GlyphsSet.SetBit(codepoint);
                total_glyphs_count++;
            }
    }

    // 3. Unpack our bit map into a flat list (we now have all the Unicode points that we know are requested _and_ available _and_ not overlapping another)
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        src_tmp.GlyphsList.reserve(src_tmp.GlyphsCount);
        UnpackBitVectorToFlatIndexList(&src_tmp.GlyphsSet, &src_tmp.GlyphsList);
        src_tmp.GlyphsSet.Clear();
        IM_ASSERT(src_tmp.GlyphsList.Size == src_tmp.GlyphsCount);
    }
    for (int dst_i = 0; dst_i < dst_tmp_array.Size; dst_i++)
        dst_tmp_array[dst_i].GlyphsSet.Clear();
    dst_tmp_array.clear();

    // Allocate packing character data and flag packed characters buffer as non-packed (x0=y0=x1=y1=0)
    // (We technically don't need to zero-clear buf_rects, but let's do it for the sake of sanity)
    ImVector<stbrp_rect> buf_rects;
    ImVector<stbtt_packedchar> buf_packedchars;
    buf_rects.resize(total_glyphs_count);
    buf_packedchars.resize(total_glyphs_count);
    memset(buf_rects.Data, 0, (size_t)buf_rects.size_in_bytes());
    memset(buf_packedchars.Data, 0, (size_t)buf_packedchars.size_in_bytes());

    // 4. Gather glyphs sizes so we can pack them in our virtual canvas.
    int total_surface = 0;
    int buf_rects_out_n = 0;
    int buf_packedchars_out_n = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        src_tmp.Rects = &buf_rects[buf_rects_out_n];
        src_tmp.PackedChars = &buf_packedchars[buf_packedchars_out_n];
        buf_rects_out_n += src_tmp.GlyphsCount;
        buf_packedchars_out_n += src_tmp.GlyphsCount;

        // Convert our ranges in the format stb_truetype wants
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        src_tmp.PackRange.font_size = cfg.SizePixels;
        src_tmp.PackRange.first_unicode_codepoint_in_range = 0;
        src_tmp.PackRange.array_of_unicode_codepoints = src_tmp.GlyphsList.Data;
        src_tmp.PackRange.num_chars = src_tmp.GlyphsList.Size;
        src_tmp.PackRange.chardata_for_range = src_tmp.PackedChars;
        src_tmp.PackRange.h_oversample = (unsigned char)cfg.OversampleH;
        src_tmp.PackRange.v_oversample = (unsigned char)cfg.OversampleV;

        // Gather the sizes of all rectangles we will need to pack (this loop is based on stbtt_PackFontRangesGatherRects)
        const float scale = (cfg.SizePixels > 0) ? stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels) : stbtt_ScaleForMappingEmToPixels(&src_tmp.FontInfo, -cfg.SizePixels);
        const int padding = atlas->TexGlyphPadding;
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsList.Size; glyph_i++)
        {
            int x0, y0, x1, y1;
            const int glyph_index_in_font = stbtt_FindGlyphIndex(&src_tmp.FontInfo, src_tmp.GlyphsList[glyph_i]);
            IM_ASSERT(glyph_index_in_font != 0);
            stbtt_GetGlyphBitmapBoxSubpixel(&src_tmp.FontInfo, glyph_index_in_font, scale * cfg.OversampleH, scale * cfg.OversampleV, 0, 0, &x0, &y0, &x1, &y1);
            src_tmp.Rects[glyph_i].w = (stbrp_coord)(x1 - x0 + padding + cfg.OversampleH - 1);
            src_tmp.Rects[glyph_i].h = (stbrp_coord)(y1 - y0 + padding + cfg.OversampleV - 1);
            total_surface += src_tmp.Rects[glyph_i].w * src_tmp.Rects[glyph_i].h;
        }
    }

    // We need a width for the skyline algorithm, any width!
    // The exact width doesn't really matter much, but some API/GPU have texture size limitations and increasing width can decrease height.
    // User can override TexDesiredWidth and TexGlyphPadding if they wish, otherwise we use a simple heuristic to select the width based on expected surface.
    const int surface_sqrt = (int)ImSqrt((float)total_surface) + 1;
    atlas->TexHeight = 0;
    if (atlas->TexDesiredWidth > 0)
        atlas->TexWidth = atlas->TexDesiredWidth;
    else
        atlas->TexWidth = (surface_sqrt >= 4096 * 0.7f) ? 4096 : (surface_sqrt >= 2048 * 0.7f) ? 2048 : (surface_sqrt >= 1024 * 0.7f) ? 1024 : 512;

    // 5. Start packing
    // Pack our extra data rectangles first, so it will be on the upper-left corner of our texture (UV will have small values).
    const int TEX_HEIGHT_MAX = 1024 * 32;
    stbtt_pack_context spc = {};
    stbtt_PackBegin(&spc, NULL, atlas->TexWidth, TEX_HEIGHT_MAX, 0, atlas->TexGlyphPadding, NULL);
    ImFontAtlasBuildPackCustomRects(atlas, spc.pack_info);

    // 6. Pack each source font. No rendering yet, we are working with rectangles in an infinitely tall texture at this point.
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbrp_pack_rects((stbrp_context*)spc.pack_info, src_tmp.Rects, src_tmp.GlyphsCount);

        // Extend texture height and mark missing glyphs as non-packed so we won't render them.
        // FIXME: We are not handling packing failure here (would happen if we got off TEX_HEIGHT_MAX or if a single if larger than TexWidth?)
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
            if (src_tmp.Rects[glyph_i].was_packed)
                atlas->TexHeight = ImMax(atlas->TexHeight, src_tmp.Rects[glyph_i].y + src_tmp.Rects[glyph_i].h);
    }

    // 7. Allocate texture
    atlas->TexHeight = (atlas->Flags & ImFontAtlasFlags_NoPowerOfTwoHeight) ? (atlas->TexHeight + 1) : ImUpperPowerOfTwo(atlas->TexHeight);
    atlas->TexUvScale = ImVec2(1.0f / atlas->TexWidth, 1.0f / atlas->TexHeight);
    atlas->TexPixelsAlpha8 = (unsigned char*)IM_ALLOC(atlas->TexWidth * atlas->TexHeight);
    memset(atlas->TexPixelsAlpha8, 0, atlas->TexWidth * atlas->TexHeight);
    spc.pixels = atlas->TexPixelsAlpha8;
    spc.height = atlas->TexHeight;

    // 8. Render/rasterize font characters into the texture
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbtt_PackFontRangesRenderIntoRects(&spc, &src_tmp.FontInfo, &src_tmp.PackRange, 1, src_tmp.Rects);

        // Apply multiply operator
        if (cfg.RasterizerMultiply != 1.0f)
        {
            unsigned char multiply_table[256];
            ImFontAtlasBuildMultiplyCalcLookupTable(multiply_table, cfg.RasterizerMultiply);
            stbrp_rect* r = &src_tmp.Rects[0];
            for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++, r++)
                if (r->was_packed)
                    ImFontAtlasBuildMultiplyRectAlpha8(multiply_table, atlas->TexPixelsAlpha8, r->x, r->y, r->w, r->h, atlas->TexWidth * 1);
        }
        src_tmp.Rects = NULL;
    }

    // End packing
    stbtt_PackEnd(&spc);
    buf_rects.clear();

    // 9. Setup ImFont and glyphs for runtime
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        // When merging fonts with MergeMode=true:
        // - We can have multiple input fonts writing into a same destination font.
        // - dst_font->ConfigData is != from cfg which is our source configuration.
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFont* dst_font = cfg.DstFont;

        const float font_scale = stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels);
        int unscaled_ascent, unscaled_descent, unscaled_line_gap;
        stbtt_GetFontVMetrics(&src_tmp.FontInfo, &unscaled_ascent, &unscaled_descent, &unscaled_line_gap);

        const float ascent = ImFloor(unscaled_ascent * font_scale + ((unscaled_ascent > 0.0f) ? +1 : -1));
        const float descent = ImFloor(unscaled_descent * font_scale + ((unscaled_descent > 0.0f) ? +1 : -1));
        ImFontAtlasBuildSetupFont(atlas, dst_font, &cfg, ascent, descent);
        const float font_off_x = cfg.GlyphOffset.x;
        const float font_off_y = cfg.GlyphOffset.y + IM_ROUND(dst_font->Ascent);

        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
        {
            // Register glyph
            const int codepoint = src_tmp.GlyphsList[glyph_i];
            const stbtt_packedchar& pc = src_tmp.PackedChars[glyph_i];
            stbtt_aligned_quad q;
            float unused_x = 0.0f, unused_y = 0.0f;
            stbtt_GetPackedQuad(src_tmp.PackedChars, atlas->TexWidth, atlas->TexHeight, glyph_i, &unused_x, &unused_y, &q, 0);
            dst_font->AddGlyph(&cfg, (ImWchar)codepoint, q.x0 + font_off_x, q.y0 + font_off_y, q.x1 + font_off_x, q.y1 + font_off_y, q.s0, q.t0, q.s1, q.t1, pc.xadvance);
        }
    }

    // Cleanup
    src_tmp_array.clear_destruct();

    ImFontAtlasBuildFinish(atlas);
    return true;
}